

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O0

socket_t getsock(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined8 uVar5;
  int enableTKA;
  int on;
  char __errmsg [256];
  stringstream __msg;
  socket_t sock;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 local_2d0;
  undefined4 in_stack_fffffffffffffd34;
  char *in_stack_fffffffffffffd38;
  vw_exception *in_stack_fffffffffffffd40;
  char local_2a8 [280];
  stringstream local_190 [16];
  ostream local_180;
  int local_4;
  
  local_4 = socket(2,1,0);
  if (local_4 < 0) {
    std::__cxx11::stringstream::stringstream(local_190);
    std::operator<<(&local_180,"socket");
    piVar2 = __errno_location();
    pcVar3 = strerror_r(*piVar2,local_2a8,0x100);
    if (pcVar3 == (char *)0x0) {
      poVar4 = std::operator<<(&local_180,"errno = ");
      std::operator<<(poVar4,local_2a8);
    }
    else {
      std::operator<<(&local_180,"errno = unknown");
    }
    iVar1 = CONCAT13(1,(int3)in_stack_fffffffffffffd34);
    uVar5 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,iVar1,
               (string *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_2d0 = 1;
  iVar1 = setsockopt(local_4,1,2,&local_2d0,4);
  if (iVar1 < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"setsockopt SO_REUSEADDR: ");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    poVar4 = std::operator<<(poVar4,pcVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = setsockopt(local_4,1,9,&stack0xfffffffffffffd2c,4);
  if (iVar1 < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"setsockopt SO_KEEPALIVE: ");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    poVar4 = std::operator<<(poVar4,pcVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return local_4;
}

Assistant:

socket_t getsock()
{
  socket_t sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock < 0)
    THROWERRNO("socket");

    // SO_REUSEADDR will allow port rebinding on Windows, causing multiple instances
    // of VW on the same machine to potentially contact the wrong tree node.
#ifndef _WIN32
  int on = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
    cerr << "setsockopt SO_REUSEADDR: " << strerror(errno) << endl;
#endif

  // Enable TCP Keep Alive to prevent socket leaks
  int enableTKA = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_KEEPALIVE, (char*)&enableTKA, sizeof(enableTKA)) < 0)
    cerr << "setsockopt SO_KEEPALIVE: " << strerror(errno) << endl;

  return sock;
}